

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_server_state_e handle_wait_ping_resp_recv(pcp_server_t *s)

{
  pcp_server_state_e local_14;
  pcp_server_state_e res;
  pcp_server_t *s_local;
  
  local_14 = handle_wait_io_receive_msg(s);
  if (local_14 == pss_wait_io) {
    local_14 = pss_wait_ping_resp;
  }
  else if (local_14 == pss_wait_io_calc_nearest_timeout) {
    local_14 = pss_send_all_msgs;
  }
  return local_14;
}

Assistant:

static pcp_server_state_e handle_wait_ping_resp_recv(pcp_server_t *s) {
    pcp_server_state_e res = handle_wait_io_receive_msg(s);

    switch (res) {
    case pss_wait_io_calc_nearest_timeout:
        res = pss_send_all_msgs;
        break;
    case pss_wait_io:
        res = pss_wait_ping_resp;
        break;
    default:
        break;
    }
    return res;
}